

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uint local_64;
  uint BTYPE;
  uint error;
  LodePNGBitReader reader;
  uint BFINAL;
  LodePNGDecompressSettings *settings_local;
  size_t insize_local;
  uchar *in_local;
  ucvector *out_local;
  
  reader._36_4_ = 0;
  local_64 = LodePNGBitReader_init((LodePNGBitReader *)&BTYPE,in,insize);
  out_local._4_4_ = local_64;
  if (local_64 == 0) {
    do {
      if (reader._36_4_ != 0) {
        return local_64;
      }
      uVar1 = ensureBits9((LodePNGBitReader *)&BTYPE,3);
      if (uVar1 == 0) {
        return 0x34;
      }
      reader._36_4_ = readBits((LodePNGBitReader *)&BTYPE,1);
      uVar1 = readBits((LodePNGBitReader *)&BTYPE,2);
      if (uVar1 == 3) {
        return 0x14;
      }
      if (uVar1 == 0) {
        local_64 = inflateNoCompression(out,(LodePNGBitReader *)&BTYPE,settings);
      }
      else {
        local_64 = inflateHuffmanBlock(out,(LodePNGBitReader *)&BTYPE,uVar1);
      }
    } while (local_64 == 0);
    out_local._4_4_ = local_64;
  }
  return out_local._4_4_;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(!ensureBits9(&reader, 3)) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE); /*compression, BTYPE 01 or 10*/

    if(error) return error;
  }

  return error;
}